

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclFindCriticalNodeWindow_rec
               (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,float fSlack,int fDept)

{
  float fVar1;
  Abc_Obj_t *pObj_00;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar2 != 2) && (uVar2 != 5)) {
    iVar3 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar3 == 0) {
      Abc_NodeSetTravIdCurrent(pObj);
      if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x85,
                      "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                     );
      }
      if (fDept == 0) {
        uVar2 = (pObj->vFanins).nSize;
        uVar5 = 0;
        uVar4 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar4 = uVar5;
        }
        fVar7 = 0.0;
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          uVar2 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar5]] + 0x10);
          fVar8 = p->pTimes[uVar2].rise;
          fVar1 = p->pTimes[uVar2].fall;
          if (fVar8 <= fVar1) {
            fVar8 = fVar1;
          }
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
        }
      }
      else {
        fVar7 = Abc_SclObjGetSlack(p,pObj,p->MaxDelay);
      }
      if (fVar7 <= 0.0) {
        fVar7 = 0.0;
      }
      for (lVar6 = 0; iVar3 = (pObj->vFanins).nSize, lVar6 < iVar3; lVar6 = lVar6 + 1) {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
        uVar2 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (((uVar2 != 2) && (uVar2 != 5)) && ((pObj_00->vFanins).nSize != 0)) {
          if (uVar2 != 7) {
            __assert_fail("Abc_ObjIsNode(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                          ,0x93,
                          "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                         );
          }
          if (fDept == 0) {
            fVar8 = p->pTimes[(uint)pObj_00->Id].rise;
            fVar1 = p->pTimes[(uint)pObj_00->Id].fall;
            if (fVar8 <= fVar1) {
              fVar8 = fVar1;
            }
            fVar8 = fVar7 - fVar8;
          }
          else {
            fVar8 = Abc_SclObjGetSlack(p,pObj_00,p->MaxDelay);
            fVar8 = fVar8 - fVar7;
          }
          if (0.0 <= fSlack - fVar8) {
            Abc_SclFindCriticalNodeWindow_rec(p,pObj_00,vPath,fSlack - fVar8,fDept);
          }
        }
      }
      if (0 < iVar3) {
        Vec_IntPush(vPath,pObj->Id);
        return;
      }
    }
  }
  return;
}

Assistant:

void Abc_SclFindCriticalNodeWindow_rec( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, float fSlack, int fDept )
{
    Abc_Obj_t * pNext;
    float fArrMax, fSlackFan;
    int i;
    if ( Abc_ObjIsCi(pObj) )
        return;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    // compute the max arrival time of the fanins
    if ( fDept )
//        fArrMax = p->pSlack[Abc_ObjId(pObj)];
        fArrMax = Abc_SclObjGetSlack(p, pObj, p->MaxDelay);
    else
        fArrMax = Abc_SclGetMaxDelayNodeFanins( p, pObj );
//    assert( fArrMax >= -1 );
    fArrMax = Abc_MaxFloat( fArrMax, 0 );
    // traverse all fanins whose arrival times are within a window
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( fDept )
//            fSlackFan = fSlack - (p->pSlack[Abc_ObjId(pNext)] - fArrMax);
            fSlackFan = fSlack - (Abc_SclObjGetSlack(p, pNext, p->MaxDelay) - fArrMax);
        else
            fSlackFan = fSlack - (fArrMax - Abc_SclObjTimeMax(p, pNext));
        if ( fSlackFan >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, pNext, vPath, fSlackFan, fDept );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}